

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icrs2obs.cpp
# Opt level: O0

CEExecOptions * DefineOpts(void)

{
  CEExecOptions *in_RDI;
  CEExecOptions *opts;
  CEExecOptions *in_stack_00000280;
  string *desc;
  CEExecOptions *__lhs;
  string *in_stack_ffffffffffffff18;
  CEExecOptions *in_stack_ffffffffffffff20;
  string local_c8 [32];
  string local_a8 [24];
  CEExecOptions *in_stack_ffffffffffffff70;
  string local_88 [32];
  string local_68 [55];
  allocator local_31;
  CEExecOptions *in_stack_ffffffffffffffd0;
  
  __lhs = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffffd0,"icrs2obs",&local_31);
  CEExecOptions::CEExecOptions(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  desc = (string *)&stack0xffffffffffffff18;
  std::__cxx11::string::string((string *)desc);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (char *)in_RDI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (char *)in_RDI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (char *)in_RDI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (char *)in_RDI);
  CLOptions::AddProgramDescription(&in_RDI->super_CLOptions,desc);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
  CEExecOptions::AddIcrsPars(in_stack_ffffffffffffffd0);
  CEExecOptions::AddObserverPars(in_stack_00000280);
  CEExecOptions::AddJDPar(in_stack_ffffffffffffff70);
  return __lhs;
}

Assistant:

CEExecOptions DefineOpts()
{
    CEExecOptions opts("icrs2obs");
    
    // Add version and description
    opts.AddProgramDescription(std::string() +
        "Converts from ICRS (solar system barycentric) coordinates to " +
        "observed altitude, zenith coordinates for a given Julian date. " +
        "Additional observing parameters can also be supplied for more " +
        "accurate coordinate values");

    // Setup the options
    opts.AddIcrsPars();
    opts.AddObserverPars();
    opts.AddJDPar();
    
    return opts;
}